

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

Entry * __thiscall Ptex::v2_2::PtexReader::MetaData::getEntry(MetaData *this,int index)

{
  size_type sVar1;
  reference ppEVar2;
  PtexReader *this_00;
  char *pos;
  int in_ESI;
  long in_RDI;
  LargeMetaData *lmdData;
  AutoMutex locker;
  Entry *e;
  Mutex *in_stack_ffffffffffffff98;
  int size;
  AutoLock<Ptex::v2_2::Mutex> *in_stack_ffffffffffffffa0;
  PtexReader *this_01;
  value_type local_8;
  
  if ((in_ESI < 0) ||
     (sVar1 = std::
              vector<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
              ::size((vector<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
                      *)(in_RDI + 0x40)), (int)sVar1 <= in_ESI)) {
    local_8 = (value_type)0x0;
  }
  else {
    ppEVar2 = std::
              vector<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
              ::operator[]((vector<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
                            *)(in_RDI + 0x40),(long)in_ESI);
    local_8 = *ppEVar2;
    if (((local_8->isLmd & 1U) != 0) && (local_8->lmdData == (LargeMetaData *)0x0)) {
      AutoLock<Ptex::v2_2::Mutex>::AutoLock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      size = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      if (local_8->lmdData == (LargeMetaData *)0x0) {
        this_00 = (PtexReader *)operator_new(0x10);
        LargeMetaData::LargeMetaData((LargeMetaData *)this_00,size);
        this_01 = this_00;
        pos = (char *)LargeMetaData::data((LargeMetaData *)this_00);
        local_8->data = pos;
        increaseMemUsed(*(PtexReader **)(in_RDI + 8),(ulong)local_8->datasize + 0x10);
        seek(this_01,(FilePos)pos);
        readZipBlock(*(PtexReader **)(in_RDI + 8),local_8->data,local_8->lmdZipSize,
                     local_8->datasize);
        local_8->lmdData = (LargeMetaData *)this_00;
      }
      AutoLock<Ptex::v2_2::Mutex>::~AutoLock((AutoLock<Ptex::v2_2::Mutex> *)0x127014);
    }
  }
  return local_8;
}

Assistant:

PtexReader::MetaData::Entry*
PtexReader::MetaData::getEntry(int index)
{
    if (index < 0 || index >= int(_entries.size())) {
        return 0;
    }

    Entry* e = _entries[index];
    if (!e->isLmd) {
        // normal (small) meta data - just return directly
        return e;
    }

    // large meta data - may not be read in yet
    if (e->lmdData) {
        // already in memory
        return e;
    }
    else {
        // not present, must read from file

        // get read lock and make sure we still need to read
        AutoMutex locker(_reader->readlock);
        if (e->lmdData) {
            return e;
        }
        // go ahead and read, keep local until finished
        LargeMetaData* lmdData = new LargeMetaData(e->datasize);
        e->data = (char*) lmdData->data();
        _reader->increaseMemUsed(sizeof(LargeMetaData) + e->datasize);
        _reader->seek(e->lmdPos);
        _reader->readZipBlock(e->data, e->lmdZipSize, e->datasize);
        // update entry
        e->lmdData = lmdData;
        return e;
    }
}